

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btSoftBodyHelpers.cpp
# Opt level: O0

void btSoftBodyHelpers::CreateEllipsoid::Hammersley::Generate(btVector3 *x,int n)

{
  float fVar1;
  int in_ESI;
  btScalar *in_RDI;
  btScalar bVar2;
  btScalar bVar3;
  btScalar s;
  btScalar a;
  btScalar w;
  int j;
  btScalar t;
  btScalar p;
  int i;
  float local_40;
  float local_3c;
  btVector3 local_38;
  float local_28;
  float local_24;
  float local_20;
  uint local_1c;
  float local_18;
  float local_14;
  uint local_10;
  int local_c;
  btScalar *local_8;
  
  local_c = in_ESI;
  local_8 = in_RDI;
  for (local_10 = 0; (int)local_10 < local_c; local_10 = local_10 + 1) {
    local_14 = 0.5;
    local_18 = 0.0;
    for (local_1c = local_10; local_1c != 0; local_1c = (int)local_1c >> 1) {
      if ((local_1c & 1) != 0) {
        local_18 = local_14 + local_18;
      }
      local_14 = local_14 * 0.5;
    }
    local_20 = local_18 + local_18 + -1.0;
    local_24 = ((float)(int)(local_10 << 1) * 3.1415927 + 3.1415927) / (float)local_c;
    bVar2 = btSqrt(0.0);
    local_28 = bVar2;
    bVar3 = btCos(0.0);
    fVar1 = local_28;
    local_3c = bVar2 * bVar3;
    bVar2 = btSin(0.0);
    local_40 = fVar1 * bVar2;
    btVector3::btVector3(&local_38,&local_3c,&local_40,&local_20);
    *(undefined8 *)local_8 = local_38.m_floats._0_8_;
    *(undefined8 *)(local_8 + 2) = local_38.m_floats._8_8_;
    local_8 = local_8 + 4;
  }
  return;
}

Assistant:

static void	Generate(btVector3* x,int n)
		{
			for(int i=0;i<n;i++)
			{
				btScalar	p=0.5,t=0;
				for(int j=i;j;p*=0.5,j>>=1) if(j&1) t+=p;
				btScalar	w=2*t-1;
				btScalar	a=(SIMD_PI+2*i*SIMD_PI)/n;
				btScalar	s=btSqrt(1-w*w);
				*x++=btVector3(s*btCos(a),s*btSin(a),w);
			}
		}